

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolAccess.cpp
# Opt level: O0

int __thiscall
bhf::ads::SymbolAccess::Write<unsigned_short>(SymbolAccess *this,SymbolEntry *entry,string *v)

{
  byte bVar1;
  long lVar2;
  ostream *poVar3;
  _func_ios_base_ptr_ios_base_ptr *local_548;
  string local_520 [32];
  stringstream local_500 [8];
  stringstream stream_1;
  ostream local_4f0 [382];
  ushort local_372;
  stringstream asStack_370 [6];
  unsigned_short value;
  stringstream converter;
  undefined1 auStack_360 [383];
  byte local_1e1;
  string local_1e0 [7];
  bool asHex;
  stringstream local_1b0 [8];
  stringstream stream;
  ostream local_1a0 [376];
  string *local_28;
  string *v_local;
  SymbolEntry *entry_local;
  SymbolAccess *this_local;
  
  local_28 = v;
  v_local = (string *)entry;
  entry_local = (SymbolEntry *)this;
  lVar2 = std::__cxx11::string::size();
  if (lVar2 == 0) {
    std::__cxx11::stringstream::stringstream(local_1b0);
    poVar3 = std::operator<<(local_1a0,"Write");
    std::operator<<(poVar3,"<T>() empty strings are not supported\n");
    std::__cxx11::stringstream::str();
    Logger::Log(3,local_1e0);
    std::__cxx11::string::~string((string *)local_1e0);
    std::__cxx11::stringstream::~stringstream(local_1b0);
    this_local._4_4_ = 0x706;
  }
  else {
    lVar2 = std::__cxx11::string::rfind((char *)local_28,0x1a9681);
    local_1e1 = lVar2 != -1;
    std::__cxx11::stringstream::stringstream(asStack_370);
    if ((local_1e1 & 1) == 0) {
      local_548 = std::dec;
    }
    else {
      local_548 = std::hex;
    }
    poVar3 = (ostream *)std::ostream::operator<<(auStack_360,local_548);
    std::operator<<(poVar3,(string *)local_28);
    local_372 = 0;
    std::istream::operator>>(asStack_370,&local_372);
    bVar1 = std::ios::fail();
    if ((bVar1 & 1) == 0) {
      local_372 = htole<unsigned_short>(local_372);
      lVar2 = AdsDevice::WriteReqEx
                        (&this->device,*(uint32_t *)(v_local + 4),*(uint32_t *)(v_local + 8),2,
                         &local_372);
      this_local._4_4_ = (int)lVar2;
    }
    else {
      std::__cxx11::stringstream::stringstream(local_500);
      poVar3 = std::operator<<(local_4f0,"Write");
      poVar3 = std::operator<<(poVar3,"() parsing \'");
      poVar3 = std::operator<<(poVar3,(string *)local_28);
      std::operator<<(poVar3,"\' failed\n");
      std::__cxx11::stringstream::str();
      Logger::Log(3,local_520);
      std::__cxx11::string::~string((string *)local_520);
      std::__cxx11::stringstream::~stringstream(local_500);
      this_local._4_4_ = 0x706;
    }
    std::__cxx11::stringstream::~stringstream(asStack_370);
  }
  return this_local._4_4_;
}

Assistant:

int SymbolAccess::Write(const SymbolEntry& entry, const std::string& v) const
{
    if (!v.size()) {
        LOG_ERROR(__FUNCTION__ << "<T>() empty strings are not supported\n");
        return ADSERR_DEVICE_INVALIDDATA;
    }

    const auto asHex = (v.npos != v.rfind("0x", 0));
    std::stringstream converter;
    converter << (asHex ? std::hex : std::dec) << v;

    T value = {};
    converter >> value;
    if (converter.fail()) {
        LOG_ERROR(__FUNCTION__ << "() parsing '" << v << "' failed\n");
        return ADSERR_DEVICE_INVALIDDATA;
    }

    value = bhf::ads::htole(value);
    return device.WriteReqEx(entry.header.iGroup,
                             entry.header.iOffs,
                             sizeof(value),
                             &value);
}